

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ClosePopupsExceptModals(void)

{
  int iVar1;
  ImGuiPopupData *pIVar2;
  ImVector<ImGuiPopupData> *this;
  int remaining;
  
  this = &GImGui->OpenPopupStack;
  iVar1 = (GImGui->OpenPopupStack).Size;
  while (remaining = iVar1, 0 < remaining) {
    pIVar2 = ImVector<ImGuiPopupData>::operator[](this,remaining + -1);
    if ((pIVar2->Window == (ImGuiWindow *)0x0) ||
       (iVar1 = remaining + -1, (pIVar2->Window->Flags & 0x8000000) != 0)) break;
  }
  if (remaining < this->Size) {
    ClosePopupToLevel(remaining,true);
    return;
  }
  return;
}

Assistant:

void ImGui::ClosePopupsExceptModals()
{
    ImGuiContext& g = *GImGui;

    int popup_count_to_keep;
    for (popup_count_to_keep = g.OpenPopupStack.Size; popup_count_to_keep > 0; popup_count_to_keep--)
    {
        ImGuiWindow* window = g.OpenPopupStack[popup_count_to_keep - 1].Window;
        if (!window || window->Flags & ImGuiWindowFlags_Modal)
            break;
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
        ClosePopupToLevel(popup_count_to_keep, true);
}